

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

void __thiscall burst::dynamic_tuple::reallocate(dynamic_tuple *this,size_t new_capacity)

{
  iterator first;
  iterator last;
  int8_t *source;
  pointer destination;
  unique_ptr<signed_char[],_std::default_delete<signed_char[]>_> local_20;
  __array new_data;
  size_t new_capacity_local;
  dynamic_tuple *this_local;
  
  new_data._M_t.super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
  super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
  super__Head_base<0UL,_signed_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<signed_char,_std::default_delete<signed_char[]>,_true,_true>)
       (__uniq_ptr_data<signed_char,_std::default_delete<signed_char[]>,_true,_true>)new_capacity;
  if (this->m_volume <= new_capacity) {
    std::make_unique<signed_char[]>((size_t)&local_20);
    this->m_capacity =
         (size_t)new_data._M_t.
                 super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
                 super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
    first = std::
            vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
            ::begin(&this->m_objects);
    last = std::
           vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
           ::end(&this->m_objects);
    source = data(this);
    destination = std::unique_ptr<signed_char[],_std::default_delete<signed_char[]>_>::get
                            (&local_20);
    management::
    move<__gnu_cxx::__normal_iterator<burst::management::object_info_t*,std::vector<burst::management::object_info_t,std::allocator<burst::management::object_info_t>>>>
              ((__normal_iterator<burst::management::object_info_t_*,_std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>_>
                )first._M_current,
               (__normal_iterator<burst::management::object_info_t_*,_std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>_>
                )last._M_current,source,destination);
    std::swap<signed_char[],std::default_delete<signed_char[]>>(&this->m_data,&local_20);
    std::unique_ptr<signed_char[],_std::default_delete<signed_char[]>_>::~unique_ptr(&local_20);
    return;
  }
  __assert_fail("new_capacity >= m_volume",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/dynamic_tuple.hpp"
                ,0x178,"void burst::dynamic_tuple::reallocate(std::size_t)");
}

Assistant:

void reallocate (std::size_t new_capacity)
        {
            assert(new_capacity >= m_volume);
            auto new_data = std::make_unique<std::int8_t[]>(new_capacity);
            m_capacity = new_capacity;

            management::move(m_objects.begin(), m_objects.end(), data(), new_data.get());
            std::swap(m_data, new_data);
        }